

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# javanano_helpers.cc
# Opt level: O2

string * __thiscall
google::protobuf::compiler::javanano::FileJavaPackage_abi_cxx11_
          (string *__return_storage_ptr__,javanano *this,Params *params,FileDescriptor *file)

{
  bool bVar1;
  string *psVar2;
  string *result;
  allocator local_19;
  
  bVar1 = Params::has_java_package((Params *)this,(string *)(params->empty_)._M_dataplus._M_p);
  if (bVar1) {
    psVar2 = Params::java_package((Params *)this,(string *)(params->empty_)._M_dataplus._M_p);
    std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)psVar2);
  }
  else {
    std::__cxx11::string::string((string *)__return_storage_ptr__,"",&local_19);
    if (*(long *)((params->empty_)._M_string_length + 8) != 0) {
      if (__return_storage_ptr__->_M_string_length != 0) {
        std::__cxx11::string::push_back((char)__return_storage_ptr__);
      }
      std::__cxx11::string::append((string *)__return_storage_ptr__);
    }
    if (__return_storage_ptr__->_M_string_length != 0) {
      std::__cxx11::string::append((char *)__return_storage_ptr__);
    }
    std::__cxx11::string::append((char *)__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

string FileJavaPackage(const Params& params, const FileDescriptor* file) {
  if (params.has_java_package(file->name())) {
    return params.java_package(file->name());
  } else {
    string result = kDefaultPackage;
    if (!file->package().empty()) {
      if (!result.empty()) result += '.';
      result += file->package();
    }

    if (!result.empty()) {
      result += ".";
    }
    result += "nano";

    return result;
  }
}